

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O0

void __thiscall
shaping_clipper::feed
          (shaping_clipper *this,float *in_samples,float *out_samples,bool diff_only,
          float *total_margin_shift)

{
  int iVar1;
  PFFFT_Setup *pPVar2;
  reference pvVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  size_type sVar7;
  vector<float,_std::allocator<float>_> *pvVar8;
  shaping_clipper *psVar9;
  float fVar10;
  float afStack_120 [4];
  float *local_110;
  int local_104;
  float local_100;
  float local_fc;
  int local_f8;
  value_type local_f4;
  value_type local_f0;
  value_type local_ec;
  shaping_clipper *local_e8;
  int local_e0;
  int local_dc;
  int i_14;
  int i_13;
  undefined1 local_d0 [4];
  int i_12;
  float max_out_diff;
  int i_11;
  int i_10;
  int i_9;
  float diff_ratio;
  float diff_needed;
  float diff_achieved;
  float mask_curve_shift;
  float local_a8;
  int window_idx_1;
  int sample_idx_1;
  int i_8;
  int i_7;
  float delta_boost;
  int i_6;
  int i_5;
  int local_88;
  int window_idx;
  int sample_idx;
  float orig_peak;
  int i_4;
  int i_3;
  float fft_ifft_scale;
  int i_2;
  PFFFT_Setup *clipping_pffft;
  int window_stride;
  int clipping_samples;
  float *mask_curve;
  float *spectrum_buf;
  float *clipping_delta;
  float *windowed_frame;
  int local_38;
  float peak;
  int i_1;
  int i;
  float *total_margin_shift_local;
  float *pfStack_20;
  bool diff_only_local;
  float *out_samples_local;
  float *in_samples_local;
  shaping_clipper *this_local;
  
  local_e8 = this;
  _i_1 = total_margin_shift;
  total_margin_shift_local._7_1_ = diff_only;
  pfStack_20 = out_samples;
  out_samples_local = in_samples;
  in_samples_local = (float *)this;
  for (peak = 0.0; (int)peak < local_e8->size - local_e8->overlap; peak = (float)((int)peak + 1)) {
    afStack_120[0] = 1.537133e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->in_frame,(long)((int)peak + local_e8->overlap));
    local_f0 = *pvVar3;
    afStack_120[0] = 1.537178e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->in_frame,(long)(int)peak);
    *pvVar3 = local_f0;
    afStack_120[0] = 1.537234e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->out_dist_frame,(long)((int)peak + local_e8->overlap));
    local_ec = *pvVar3;
    afStack_120[0] = 1.537279e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->out_dist_frame,(long)(int)peak);
    *pvVar3 = local_ec;
  }
  for (local_38 = 0; local_38 < local_e8->overlap; local_38 = local_38 + 1) {
    local_f4 = out_samples_local[local_38];
    afStack_120[0] = 1.537418e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->in_frame,(long)((local_38 + local_e8->size) - local_e8->overlap))
    ;
    *pvVar3 = local_f4;
    afStack_120[0] = 1.537477e-39;
    afStack_120[1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&local_e8->out_dist_frame,
                        (long)((local_38 + local_e8->size) - local_e8->overlap));
    *pvVar3 = 0.0;
  }
  clipping_delta =
       (float *)((long)afStack_120 +
                (8 - ((long)local_e8->size * (long)local_e8->oversample * 4 + 0xfU &
                     0xfffffffffffffff0)));
  spectrum_buf = (float *)((long)clipping_delta -
                          ((long)local_e8->size * (long)local_e8->oversample * 4 + 0xfU &
                          0xfffffffffffffff0));
  mask_curve = (float *)((long)spectrum_buf -
                        ((long)local_e8->size * (long)local_e8->oversample * 4 + 0xfU &
                        0xfffffffffffffff0));
  pfVar4 = (float *)((long)mask_curve -
                    ((long)(local_e8->size / 2) * 4 + 0x13U & 0xfffffffffffffff0));
  pvVar8 = &local_e8->in_frame;
  _window_stride = pfVar4;
  pfVar4[-2] = 1.537729e-39;
  pfVar4[-1] = 0.0;
  pfVar5 = std::vector<float,_std::allocator<float>_>::data(pvVar8);
  pfVar6 = clipping_delta;
  psVar9 = local_e8;
  pfVar4[-2] = 1.537758e-39;
  pfVar4[-1] = 0.0;
  apply_window(psVar9,pfVar5,pfVar6,false);
  pfVar5 = clipping_delta;
  pfVar6 = mask_curve;
  pPVar2 = local_e8->pffft;
  pfVar4[-2] = 1.537802e-39;
  pfVar4[-1] = 0.0;
  pffft_transform_ordered(pPVar2,pfVar5,pfVar6,(float *)0x0,PFFFT_FORWARD);
  pfVar5 = mask_curve;
  pfVar6 = _window_stride;
  psVar9 = local_e8;
  pfVar4[-2] = 1.53783e-39;
  pfVar4[-1] = 0.0;
  calculate_mask_curve(psVar9,pfVar5,pfVar6);
  psVar9 = local_e8;
  clipping_pffft._4_4_ = local_e8->size * local_e8->oversample;
  clipping_pffft._0_4_ = local_e8->max_oversample / local_e8->oversample;
  _fft_ifft_scale = local_e8->pffft;
  if (1 < local_e8->oversample) {
    pPVar2 = local_e8->pffft_oversampled;
    mask_curve[local_e8->size] = mask_curve[1] / 2.0;
    _fft_ifft_scale = pPVar2;
    mask_curve[1] = 0.0;
    pfVar5 = clipping_delta;
    pfVar6 = mask_curve;
    i_3 = psVar9->size;
    while (i_3 = i_3 + 1, i_3 < local_e8->size * local_e8->oversample) {
      mask_curve[i_3] = 0.0;
    }
    pPVar2 = local_e8->pffft_oversampled;
    pfVar4[-2] = 1.538113e-39;
    pfVar4[-1] = 0.0;
    pffft_transform_ordered(pPVar2,pfVar6,pfVar5,(float *)0x0,PFFFT_BACKWARD);
    iVar1 = local_e8->size;
    for (orig_peak = 0.0; (int)orig_peak < clipping_pffft._4_4_;
        orig_peak = (float)((int)orig_peak + 1)) {
      clipping_delta[(int)orig_peak] = clipping_delta[(int)orig_peak] / (float)iVar1;
    }
    for (sample_idx = 0; local_f8 = sample_idx, i_4 = (int)(float)iVar1,
        sample_idx < local_e8->size / 2 + 1; sample_idx = sample_idx + 1) {
      _window_stride[sample_idx] = (float)local_e8->oversample * _window_stride[sample_idx];
    }
  }
  window_idx = 0;
  i_5 = 0;
  for (local_88 = 0; local_88 < clipping_pffft._4_4_; local_88 = local_88 + 1) {
    local_fc = clipping_delta[local_88];
    pvVar8 = &local_e8->inv_window;
    sVar7 = (size_type)i_5;
    pfVar4[-2] = 1.538449e-39;
    pfVar4[-1] = 0.0;
    std::vector<float,_std::allocator<float>_>::operator[](pvVar8,sVar7);
    pfVar4[-2] = 1.538473e-39;
    pfVar4[-1] = 0.0;
    std::abs((int)pvVar8);
    pfVar4[-2] = 1.538507e-39;
    pfVar4[-1] = 0.0;
    pfVar6 = std::max<float>((float *)&window_idx,(float *)&i_6);
    window_idx = (int)*pfVar6;
    i_5 = (int)clipping_pffft + i_5;
  }
  fVar10 = (float)window_idx / local_e8->clip_level;
  for (delta_boost = 0.0; (int)delta_boost < clipping_pffft._4_4_;
      delta_boost = (float)((int)delta_boost + 1)) {
    spectrum_buf[(int)delta_boost] = 0.0;
  }
  if (_i_1 != (float *)0x0) {
    *_i_1 = 1.0;
  }
  window_idx = (int)fVar10;
  windowed_frame._4_4_ = fVar10;
  for (i_7 = 0; pfVar5 = clipping_delta, pfVar6 = spectrum_buf, psVar9 = local_e8,
      (float)i_7 < local_e8->iterations; i_7 = i_7 + 1) {
    i_8 = 0x3f800000;
    if ((local_e8->iterations - local_e8->iterations / 3.0 <= (float)i_7) &&
       (windowed_frame._4_4_ < 2.0)) {
      i_8 = 0x40000000;
    }
    iVar1 = i_8;
    pfVar4[-2] = 1.53896e-39;
    pfVar4[-1] = 0.0;
    clip_to_window(psVar9,pfVar5,pfVar6,(float)iVar1);
    pfVar5 = spectrum_buf;
    pfVar6 = mask_curve;
    pPVar2 = _fft_ifft_scale;
    pfVar4[-2] = 1.538994e-39;
    pfVar4[-1] = 0.0;
    pffft_transform_ordered(pPVar2,pfVar5,pfVar6,(float *)0x0,PFFFT_FORWARD);
    psVar9 = local_e8;
    if (1 < local_e8->oversample) {
      mask_curve[1] = 0.0;
      sample_idx_1 = psVar9->size;
      while (sample_idx_1 = sample_idx_1 + 1, sample_idx_1 < local_e8->size * local_e8->oversample)
      {
        mask_curve[sample_idx_1] = 0.0;
      }
    }
    pfVar5 = mask_curve;
    pfVar6 = _window_stride;
    psVar9 = local_e8;
    pfVar4[-2] = 1.539168e-39;
    pfVar4[-1] = 0.0;
    limit_clip_spectrum(psVar9,pfVar5,pfVar6);
    pfVar5 = spectrum_buf;
    pfVar6 = mask_curve;
    pPVar2 = _fft_ifft_scale;
    pfVar4[-2] = 1.539206e-39;
    pfVar4[-1] = 0.0;
    pffft_transform_ordered(pPVar2,pfVar6,pfVar5,(float *)0x0,PFFFT_BACKWARD);
    for (window_idx_1 = 0; window_idx_1 < clipping_pffft._4_4_; window_idx_1 = window_idx_1 + 1) {
      spectrum_buf[window_idx_1] = spectrum_buf[window_idx_1] / (float)clipping_pffft._4_4_;
    }
    windowed_frame._4_4_ = 0.0;
    mask_curve_shift = 0.0;
    for (local_a8 = 0.0; (int)local_a8 < clipping_pffft._4_4_; local_a8 = (float)((int)local_a8 + 1)
        ) {
      local_100 = clipping_delta[(int)local_a8] + spectrum_buf[(int)local_a8];
      pvVar8 = &local_e8->inv_window;
      sVar7 = (size_type)(int)mask_curve_shift;
      pfVar4[-2] = 1.539454e-39;
      pfVar4[-1] = 0.0;
      std::vector<float,_std::allocator<float>_>::operator[](pvVar8,sVar7);
      pfVar4[-2] = 1.539478e-39;
      pfVar4[-1] = 0.0;
      std::abs((int)pvVar8);
      pfVar4[-2] = 1.539511e-39;
      pfVar4[-1] = 0.0;
      pfVar6 = std::max<float>((float *)((long)&windowed_frame + 4),&diff_achieved);
      windowed_frame._4_4_ = *pfVar6;
      mask_curve_shift = (float)((int)clipping_pffft + (int)mask_curve_shift);
    }
    windowed_frame._4_4_ = windowed_frame._4_4_ / local_e8->clip_level;
    diff_needed = 1.122;
    if ((1.0 < (float)window_idx) && (1.0 < windowed_frame._4_4_)) {
      diff_ratio = (float)window_idx - windowed_frame._4_4_;
      if ((local_e8->iterations - local_e8->iterations / 3.0 <= (float)(i_7 + 1)) ||
         (diff_ratio <= 0.0)) {
        pfVar4[-2] = 1.54002e-39;
        pfVar4[-1] = 0.0;
        pfVar6 = std::max<float>(&diff_needed,(float *)((long)&windowed_frame + 4));
        diff_needed = *pfVar6;
      }
      else {
        i_9 = (int)((float)window_idx - 1.0);
        i_10 = (int)((float)i_9 / diff_ratio);
        pfVar4[-2] = 1.539935e-39;
        pfVar4[-1] = 0.0;
        pfVar6 = std::min<float>((float *)&i_10,(float *)((long)&windowed_frame + 4));
        i_10 = (int)*pfVar6;
        pfVar4[-2] = 1.539978e-39;
        pfVar4[-1] = 0.0;
        pfVar6 = std::max<float>(&diff_needed,(float *)&i_10);
        diff_needed = *pfVar6;
      }
    }
    fVar10 = (diff_needed - 1.0) * local_e8->adaptive_distortion_strength + 1.0;
    if (((_i_1 != (float *)0x0) && (1.01 < windowed_frame._4_4_)) &&
       ((float)i_7 < local_e8->iterations - 1.0)) {
      *_i_1 = fVar10 * *_i_1;
    }
    for (i_11 = 0; local_104 = i_11, i_11 < local_e8->size / 2 + 1; i_11 = i_11 + 1) {
      _window_stride[i_11] = fVar10 * _window_stride[i_11];
    }
    diff_needed = fVar10;
  }
  if (1 < local_e8->oversample) {
    for (max_out_diff = 0.0; (int)max_out_diff < local_e8->size;
        max_out_diff = (float)((int)max_out_diff + 1)) {
      spectrum_buf[(int)max_out_diff] = spectrum_buf[(int)max_out_diff * local_e8->oversample];
    }
  }
  local_110 = spectrum_buf;
  pvVar8 = &local_e8->out_dist_frame;
  pfVar4[-2] = 1.540611e-39;
  pfVar4[-1] = 0.0;
  pfVar5 = std::vector<float,_std::allocator<float>_>::data(pvVar8);
  psVar9 = local_e8;
  pfVar6 = local_110;
  pfVar4[-2] = 1.540649e-39;
  pfVar4[-1] = 0.0;
  apply_window(psVar9,pfVar6,pfVar5,true);
  for (i_12 = 0; i_12 < local_e8->overlap; i_12 = i_12 + 1) {
    psVar9 = (shaping_clipper *)&local_e8->out_dist_frame;
    sVar7 = (size_type)i_12;
    pfVar4[-2] = 1.54072e-39;
    pfVar4[-1] = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)psVar9,sVar7);
    pfStack_20[i_12] = *pvVar3 / 1.5;
  }
  if (1 < local_e8->oversample) {
    local_d0 = (undefined1  [4])0x0;
    for (i_13 = 0; i_13 < local_e8->overlap; i_13 = i_13 + 1) {
      pfVar4[-2] = 1.540908e-39;
      pfVar4[-1] = 0.0;
      std::abs((int)psVar9);
      psVar9 = (shaping_clipper *)local_d0;
      pfVar4[-2] = 1.540946e-39;
      pfVar4[-1] = 0.0;
      pfVar6 = std::max<float>((float *)psVar9,(float *)&i_14);
      local_d0 = (undefined1  [4])*pfVar6;
    }
    if ((float)local_d0 < local_e8->clip_level * 0.001) {
      for (local_dc = 0; local_dc < local_e8->overlap; local_dc = local_dc + 1) {
        pfStack_20[local_dc] = 0.0;
      }
    }
  }
  if ((total_margin_shift_local._7_1_ & 1) == 0) {
    for (local_e0 = 0; local_e0 < local_e8->overlap; local_e0 = local_e0 + 1) {
      pvVar8 = &local_e8->in_frame;
      sVar7 = (size_type)local_e0;
      pfVar4[-2] = 1.541227e-39;
      pfVar4[-1] = 0.0;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](pvVar8,sVar7);
      pfStack_20[local_e0] = *pvVar3 + pfStack_20[local_e0];
    }
  }
  return;
}

Assistant:

void shaping_clipper::feed(const float* in_samples, float* out_samples, bool diff_only, float* total_margin_shift) {
    // shift in/out buffers
    for (int i = 0; i < this->size - this->overlap; i++) {
        this->in_frame[i] = this->in_frame[i + this->overlap];
        this->out_dist_frame[i] = this->out_dist_frame[i + this->overlap];
    }
    for (int i = 0; i < this->overlap; i++) {
        this->in_frame[i + this->size - this->overlap] = in_samples[i];
        this->out_dist_frame[i + this->size - this->overlap] = 0;
    }

    float peak;
    float* windowed_frame = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* clipping_delta = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* spectrum_buf = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* mask_curve = (float*)alloca(sizeof(float) * (this->size / 2 + 1));

    apply_window(this->in_frame.data(), windowed_frame);
    pffft_transform_ordered(this->pffft, windowed_frame, spectrum_buf, NULL, PFFFT_FORWARD);
    calculate_mask_curve(spectrum_buf, mask_curve);

    int clipping_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    PFFFT_Setup* clipping_pffft = this->pffft;
    if (this->oversample > 1) {
        clipping_pffft = this->pffft_oversampled;

        // use IFFT to oversample the windowed frame
        spectrum_buf[this->size] = spectrum_buf[1] / 2;
        spectrum_buf[1] = 0;
        for (int i = this->size + 1; i < this->size * this->oversample; i++) {
            spectrum_buf[i] = 0;
        }
        pffft_transform_ordered(this->pffft_oversampled, spectrum_buf, windowed_frame, NULL, PFFFT_BACKWARD);
        float fft_ifft_scale = this->size;
        for (int i = 0; i < clipping_samples; i++) {
            windowed_frame[i] /= fft_ifft_scale;
        }

        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= this->oversample;
        }
    }

    float orig_peak = 0;
    for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
        orig_peak = std::max<float>(orig_peak, std::abs(windowed_frame[sample_idx] * inv_window[window_idx]));
    }
    orig_peak /= this->clip_level;
    peak = orig_peak;

    // clear clipping_delta
    for (int i = 0; i < clipping_samples; i++) {
        clipping_delta[i] = 0;
    }

    if (total_margin_shift) {
        *total_margin_shift = 1.0;
    }

    // repeat clipping-filtering process a few times to control both the peaks and the spectrum
    for (int i = 0; i < this->iterations; i++) {
        // The last 1/3 of rounds have boosted delta to help reach the peak target faster
        float delta_boost = 1.0;
        if (i >= this->iterations - this->iterations / 3) {
            // boosting the delta when largs peaks are still present is dangerous
            if (peak < 2.0) {
                delta_boost = 2.0;
            }
        }
        clip_to_window(windowed_frame, clipping_delta, delta_boost);

        pffft_transform_ordered(clipping_pffft, clipping_delta, spectrum_buf, NULL, PFFFT_FORWARD);

        if (this->oversample > 1) {
            // Zero out all frequency bins above the base nyquist rate.
            // limit_clip_spectrum doesn't handle these bins.
            spectrum_buf[1] = 0;
            for (int i = this->size + 1; i < this->size * this->oversample; i++) {
                spectrum_buf[i] = 0;
            }
        }

        limit_clip_spectrum(spectrum_buf, mask_curve);

        pffft_transform_ordered(clipping_pffft, spectrum_buf, clipping_delta, NULL, PFFFT_BACKWARD);
        // see pffft.h
        for (int i = 0; i < clipping_samples; i++) {
            clipping_delta[i] /= clipping_samples;
        }

        peak = 0;
        for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
            peak = std::max<float>(peak, std::abs((windowed_frame[sample_idx] + clipping_delta[sample_idx]) * inv_window[window_idx]));
        }
        peak /= this->clip_level;

        // Automatically adjust mask_curve as necessary to reach peak target
        float mask_curve_shift = 1.122; // 1.122 is 1dB
        if (orig_peak > 1.0 && peak > 1.0) {
            float diff_achieved = orig_peak - peak;
            if (i + 1 < this->iterations - this->iterations / 3 && diff_achieved > 0) {
                float diff_needed = orig_peak - 1.0;
                float diff_ratio = diff_needed / diff_achieved;
                // If a good amount of peak reduction was already achieved,
                // don't shift the mask_curve by the full peak value
                // On the other hand, if only a little peak reduction was achieved,
                // don't shift the mask_curve by the enormous diff_ratio.
                diff_ratio = std::min<float>(diff_ratio, peak);
                mask_curve_shift = std::max<float>(mask_curve_shift, diff_ratio);
            } else {
                // If the peak got higher than the input or we are in the last 1/3 rounds,
                // go back to the heavy-handed peak heuristic.
                mask_curve_shift = std::max<float>(mask_curve_shift, peak);
            }
        }

        mask_curve_shift = 1.0 + (mask_curve_shift - 1.0) * this->adaptive_distortion_strength;

        if (total_margin_shift && peak > 1.01 && i < this->iterations - 1) {
            *total_margin_shift *= mask_curve_shift;
        }

        // Be less strict in the next iteration.
        // This helps with peak control.
        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= mask_curve_shift;
        }
    }

    if (this->oversample > 1) {
        // Downsample back to original rate.
        // We already zeroed out all frequency bins above the base nyquist rate so we can simply drop samples here.
        for (int i = 0; i < this->size; i++) {
            clipping_delta[i] = clipping_delta[i * this->oversample];
        }
    }

    // do overlap & add
    apply_window(clipping_delta, this->out_dist_frame.data(), true);

    for (int i = 0; i < this->overlap; i++) {
        // 4 times overlap with squared hanning window results in 1.5 time increase in amplitude
        out_samples[i] = this->out_dist_frame[i] / 1.5;
    }

    if (this->oversample > 1) {
        // When oversampling is active, the clipping delta can be non-zero even if all the samples in the frame are well below the threshold.
        // This is likely due to the aliasing introduced when windowing near-nyquist frequencies.
        // For purity, detect and remove these unwanted changes to the input signal.
        // The effect on peak control is < 0.1% or -60dB. Oversampling is not exact anyway.
        float max_out_diff = 0;
        for (int i = 0; i < this->overlap; i++) {
            max_out_diff = std::max(max_out_diff, std::abs(out_samples[i]));
        }
        if (max_out_diff < this->clip_level * 0.001) {
            for (int i = 0; i < this->overlap; i++) {
                out_samples[i] = 0;
            }
        }
    }

    if (!diff_only) {
        for (int i = 0; i < this->overlap; i++) {
            out_samples[i] += this->in_frame[i];
        }
    }
}